

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

_Bool readInstruction32(uint8_t *code,size_t code_len,uint32_t *insn)

{
  uint32_t *insn_local;
  size_t code_len_local;
  uint8_t *code_local;
  
  if (3 < code_len) {
    *insn = *(uint32_t *)code;
  }
  return 3 < code_len;
}

Assistant:

static DecodeStatus readInstruction32(const uint8_t *code, size_t len, uint32_t *Insn)
{
	uint8_t Bytes[4];

	if (len < 4)
		// not enough data
		return MCDisassembler_Fail;

	memcpy(Bytes, code, 4);

	// Encoded as a big-endian 32-bit word in the stream.
	*Insn = (Bytes[3] <<  0) |
		(Bytes[2] <<  8) |
		(Bytes[1] << 16) |
		(Bytes[0] << 24);

	return MCDisassembler_Success;
}